

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.hpp
# Opt level: O0

void __thiscall Options::~Options(Options *this)

{
  Options *this_local;
  
  std::optional<std::filesystem::__cxx11::path>::~optional(&this->input);
  std::optional<std::filesystem::__cxx11::path>::~optional(&this->tilemap);
  std::optional<std::filesystem::__cxx11::path>::~optional(&this->palmap);
  std::optional<std::filesystem::__cxx11::path>::~optional(&this->palettes);
  std::optional<std::filesystem::__cxx11::path>::~optional(&this->output);
  std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::~vector
            (&this->palSpec);
  std::optional<std::filesystem::__cxx11::path>::~optional(&this->attrmap);
  return;
}

Assistant:

bool reverse() const { return reversedWidth != 0; }